

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemDependenceGraph.h
# Opt level: O2

DGBBlock * __thiscall
dg::llvmdg::SystemDependenceGraph::getBBlock(SystemDependenceGraph *this,BasicBlock *b)

{
  const_iterator cVar1;
  DGBBlock *pDVar2;
  BasicBlock *local_10;
  
  local_10 = b;
  cVar1 = std::
          _Rb_tree<const_llvm::BasicBlock_*,_std::pair<const_llvm::BasicBlock_*const,_dg::sdg::DGBBlock_*>,_std::_Select1st<std::pair<const_llvm::BasicBlock_*const,_dg::sdg::DGBBlock_*>_>,_std::less<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_dg::sdg::DGBBlock_*>_>_>
          ::find((_Rb_tree<const_llvm::BasicBlock_*,_std::pair<const_llvm::BasicBlock_*const,_dg::sdg::DGBBlock_*>,_std::_Select1st<std::pair<const_llvm::BasicBlock_*const,_dg::sdg::DGBBlock_*>_>,_std::less<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_dg::sdg::DGBBlock_*>_>_>
                  *)(this + 0x120),&local_10);
  if (cVar1._M_node == (_Base_ptr)(this + 0x128)) {
    pDVar2 = (DGBBlock *)0x0;
  }
  else {
    pDVar2 = (DGBBlock *)cVar1._M_node[1]._M_parent;
  }
  return pDVar2;
}

Assistant:

sdg::DGBBlock *getBBlock(const llvm::BasicBlock *b) const {
        auto it = _blk_mapping.find(b);
        return it == _blk_mapping.end() ? nullptr : it->second;
    }